

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O2

FIOBJ fiobj_hash_new2(size_t capa)

{
  undefined1 *puVar1;
  int *piVar2;
  byte bVar3;
  
  puVar1 = (undefined1 *)fio_malloc(0x38);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x2a;
    *(undefined2 *)(puVar1 + 1) = 0;
    puVar1[3] = 0;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(undefined8 *)(puVar1 + 8) = 0;
    *(undefined8 *)(puVar1 + 0x10) = 0;
    *(undefined8 *)(puVar1 + 0x18) = 0;
    *(undefined8 *)(puVar1 + 0x20) = 0;
    *(undefined8 *)(puVar1 + 0x28) = 0;
    *(undefined8 *)(puVar1 + 0x30) = 0;
    if (*(ulong *)(puVar1 + 0x10) < capa) {
      bVar3 = 1;
      do {
        bVar3 = bVar3 + 1;
      } while ((ulong)(1L << (bVar3 & 0x3f)) < capa);
      puVar1[0x31] = bVar3;
      fio_hash___rehash((fio_hash___s *)(puVar1 + 8));
    }
    return (ulong)puVar1 | 4;
  }
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR(
                  "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c:177"
                  );
  }
  kill(0,2);
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

FIOBJ fiobj_hash_new2(size_t capa) {
  fiobj_hash_s *h = fio_malloc(sizeof(*h));
  FIO_ASSERT_ALLOC(h);
  *h = (fiobj_hash_s){.head = {.ref = 1, .type = FIOBJ_T_HASH},
                      .hash = FIO_SET_INIT};
  fio_hash___capa_require(&h->hash, capa);
  return (FIOBJ)h | FIOBJECT_HASH_FLAG;
}